

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surf.cc
# Opt level: O0

SatType __thiscall features::Surf::filter_dxy(Surf *this,int fs,int x,int y)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  int iVar16;
  int index;
  int index_00;
  int index_01;
  ImageBase *this_00;
  element_type *peVar17;
  long *plVar18;
  SatType v3;
  SatType v2;
  SatType v1;
  SatType v0;
  SatType ret;
  int row4;
  int row3;
  int row2;
  int row1;
  int w;
  int y_local;
  int x_local;
  int fs_local;
  Surf *this_local;
  
  this_00 = (ImageBase *)
            std::__shared_ptr_access<core::Image<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<core::Image<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&this->sat);
  iVar16 = core::ImageBase::width(this_00);
  index = (x - fs) + -1 + iVar16 * ((y - fs) + -1);
  index_00 = index + iVar16 * fs;
  index_01 = index_00 + iVar16;
  iVar16 = index_01 + iVar16 * fs;
  peVar17 = std::__shared_ptr_access<core::Image<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<core::Image<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&this->sat);
  plVar18 = core::Image<long>::at(peVar17,index);
  lVar1 = *plVar18;
  peVar17 = std::__shared_ptr_access<core::Image<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<core::Image<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&this->sat);
  plVar18 = core::Image<long>::at(peVar17,index + fs);
  lVar2 = *plVar18;
  peVar17 = std::__shared_ptr_access<core::Image<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<core::Image<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&this->sat);
  plVar18 = core::Image<long>::at(peVar17,index_00);
  lVar3 = *plVar18;
  peVar17 = std::__shared_ptr_access<core::Image<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<core::Image<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&this->sat);
  plVar18 = core::Image<long>::at(peVar17,index_00 + fs);
  lVar4 = *plVar18;
  peVar17 = std::__shared_ptr_access<core::Image<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<core::Image<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&this->sat);
  plVar18 = core::Image<long>::at(peVar17,index + fs + 1);
  lVar5 = *plVar18;
  peVar17 = std::__shared_ptr_access<core::Image<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<core::Image<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&this->sat);
  plVar18 = core::Image<long>::at(peVar17,index + fs * 2 + 1);
  lVar6 = *plVar18;
  peVar17 = std::__shared_ptr_access<core::Image<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<core::Image<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&this->sat);
  plVar18 = core::Image<long>::at(peVar17,index_00 + fs + 1);
  lVar7 = *plVar18;
  peVar17 = std::__shared_ptr_access<core::Image<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<core::Image<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&this->sat);
  plVar18 = core::Image<long>::at(peVar17,index_00 + fs * 2 + 1);
  lVar8 = *plVar18;
  peVar17 = std::__shared_ptr_access<core::Image<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<core::Image<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&this->sat);
  plVar18 = core::Image<long>::at(peVar17,index_01);
  lVar9 = *plVar18;
  peVar17 = std::__shared_ptr_access<core::Image<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<core::Image<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&this->sat);
  plVar18 = core::Image<long>::at(peVar17,index_01 + fs);
  lVar10 = *plVar18;
  peVar17 = std::__shared_ptr_access<core::Image<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<core::Image<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&this->sat);
  plVar18 = core::Image<long>::at(peVar17,iVar16);
  lVar11 = *plVar18;
  peVar17 = std::__shared_ptr_access<core::Image<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<core::Image<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&this->sat);
  plVar18 = core::Image<long>::at(peVar17,iVar16 + fs);
  lVar12 = *plVar18;
  peVar17 = std::__shared_ptr_access<core::Image<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<core::Image<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&this->sat);
  plVar18 = core::Image<long>::at(peVar17,index_01 + fs + 1);
  lVar13 = *plVar18;
  peVar17 = std::__shared_ptr_access<core::Image<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<core::Image<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&this->sat);
  plVar18 = core::Image<long>::at(peVar17,index_01 + fs * 2 + 1);
  lVar14 = *plVar18;
  peVar17 = std::__shared_ptr_access<core::Image<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<core::Image<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&this->sat);
  plVar18 = core::Image<long>::at(peVar17,iVar16 + fs + 1);
  lVar15 = *plVar18;
  peVar17 = std::__shared_ptr_access<core::Image<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<core::Image<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&this->sat);
  plVar18 = core::Image<long>::at(peVar17,iVar16 + fs * 2 + 1);
  return (((*plVar18 + lVar13) - lVar15) - lVar14) +
         (((((lVar4 + lVar1) - lVar3) - lVar2) - (((lVar8 + lVar5) - lVar7) - lVar6)) -
         (((lVar12 + lVar9) - lVar11) - lVar10));
}

Assistant:

Surf::SatType
Surf::filter_dxy (int fs, int x, int y)
{
    int const w = this->sat->width();
    int const row1 = (x - fs - 1) + w * (y - fs - 1);
    int const row2 = row1 + w * fs;
    int const row3 = row2 + w;
    int const row4 = row3 + w * fs;

    Surf::SatType ret = 0;
    Surf::SatType v0 = this->sat->at(row1);
    Surf::SatType v1 = this->sat->at(row1 + fs);
    Surf::SatType v2 = this->sat->at(row2);
    Surf::SatType v3 = this->sat->at(row2 + fs);
    ret += v3 + v0 - v2 - v1;

    v0 = this->sat->at(row1 + fs + 1);
    v1 = this->sat->at(row1 + fs + fs + 1);
    v2 = this->sat->at(row2 + fs + 1);
    v3 = this->sat->at(row2 + fs + fs + 1);
    ret -= v3 + v0 - v2 - v1;

    v0 = this->sat->at(row3);
    v1 = this->sat->at(row3 + fs);
    v2 = this->sat->at(row4);
    v3 = this->sat->at(row4 + fs);
    ret -= v3 + v0 - v2 - v1;

    v0 = this->sat->at(row3 + fs + 1);
    v1 = this->sat->at(row3 + fs + fs + 1);
    v2 = this->sat->at(row4 + fs + 1);
    v3 = this->sat->at(row4 + fs + fs + 1);
    ret += v3 + v0 - v2 - v1;

    return ret;
}